

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_39db::TlbExportVisitor::visit_(TlbExportVisitor *this,Numeric *type)

{
  NumericCategory category;
  ostream *poVar1;
  char *pcVar2;
  ulong uVar3;
  TlbExportVisitor local_88 [32];
  TlbExportVisitor local_68 [48];
  string local_38 [32];
  Numeric *local_18;
  Numeric *type_local;
  TlbExportVisitor *this_local;
  
  local_18 = type;
  type_local = (Numeric *)this;
  poVar1 = std::operator<<(this->m_stream,"<numeric name=\"");
  Typelib::Type::getName_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = std::operator<<(poVar1,"\" ");
  poVar1 = std::operator<<(poVar1,"category=\"");
  category = Typelib::Numeric::getNumericCategory();
  pcVar2 = anon_unknown_3::getStringCategory(category);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\" ");
  poVar1 = std::operator<<(poVar1,"size=\"");
  uVar3 = Typelib::Type::getSize();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3);
  poVar1 = std::operator<<(poVar1,"\" ");
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_(local_68);
  poVar1 = std::operator<<(poVar1,(string *)local_68);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_38);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_(local_88,(Type *)this);
  poVar1 = std::operator<<(poVar1,(string *)local_88);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)local_88);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  std::operator<<(poVar1,"</numeric>");
  return true;
}

Assistant:

bool TlbExportVisitor::visit_(Numeric const& type)
    {
        m_stream
            << "<numeric name=\"" << type.getName() << "\" "
            << "category=\"" << getStringCategory(type.getNumericCategory()) << "\" "
            << "size=\"" << type.getSize() << "\" " << emitSourceID() << ">\n";
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</numeric>";

        return true;
    }